

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O0

void pinThread(int cpu)

{
  int iVar1;
  pthread_t __th;
  ulong uVar2;
  size_t __cpu;
  cpu_set_t cpuset;
  int cpu_local;
  
  if (-1 < cpu) {
    cpuset.__bits[0xf]._4_4_ = cpu;
    memset(&__cpu,0,0x80);
    if ((ulong)(long)cpuset.__bits[0xf]._4_4_ >> 3 < 0x80) {
      uVar2 = (ulong)(long)cpuset.__bits[0xf]._4_4_ >> 6;
      cpuset.__bits[uVar2 - 1] =
           1L << ((byte)cpuset.__bits[0xf]._4_4_ & 0x3f) | cpuset.__bits[uVar2 - 1];
    }
    __th = pthread_self();
    iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&__cpu);
    if (iVar1 == -1) {
      perror("pthread_setaffinity_no");
      exit(1);
    }
  }
  return;
}

Assistant:

void pinThread(int cpu) {
  if (cpu < 0) {
    return;
  }
  cpu_set_t cpuset;
  CPU_ZERO(&cpuset);
  CPU_SET(cpu, &cpuset);
  if (pthread_setaffinity_np(pthread_self(), sizeof(cpu_set_t), &cpuset) ==
      -1) {
    perror("pthread_setaffinity_no");
    exit(1);
  }
}